

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O2

ares_slist_node_t * ares_slist_insert(ares_slist_t *list,void *val)

{
  ares_slist_node_t *node;
  ulong uVar1;
  size_t sVar2;
  ares_slist_node_t **ppaVar3;
  ulong uVar4;
  size_t sVar5;
  size_t size;
  
  if ((val != (void *)0x0 && list != (ares_slist_t *)0x0) &&
     (node = (ares_slist_node_t *)ares_malloc_zero(0x28), node != (ares_slist_node_t *)0x0)) {
    node->data = val;
    node->parent = list;
    sVar5 = list->cnt + 1;
    if (sVar5 < 0x11) {
      uVar1 = 4;
    }
    else {
      sVar5 = ares_round_up_pow2(sVar5);
      uVar1 = ares_log2(sVar5);
    }
    sVar5 = list->rand_bits;
    if (uVar1 < list->levels) {
      uVar1 = list->levels;
    }
    size = 0;
    uVar4 = 0;
    do {
      sVar2 = sVar5;
      if (sVar5 == 0) {
        ares_rand_bytes(list->rand_state,list->rand_data,8);
        sVar2 = 0x40;
      }
      uVar4 = uVar4 + 1;
      sVar5 = sVar2 - 1;
      list->rand_bits = sVar5;
      size = size + 8;
    } while (((list->rand_data[0x40 - sVar2 >> 3] >> ((uint)(0x40 - sVar2) & 7) & 1) != 0) &&
            (uVar4 < uVar1));
    node->levels = uVar4;
    ppaVar3 = (ares_slist_node_t **)ares_malloc_zero(size);
    node->next = ppaVar3;
    if (ppaVar3 != (ares_slist_node_t **)0x0) {
      ppaVar3 = (ares_slist_node_t **)ares_malloc_zero(node->levels << 3);
      node->prev = ppaVar3;
      if (ppaVar3 != (ares_slist_node_t **)0x0) {
        if (node->levels <= list->levels) {
LAB_0011b260:
          ares_slist_node_push(list,node);
          list->cnt = list->cnt + 1;
          return node;
        }
        ppaVar3 = (ares_slist_node_t **)
                  ares_realloc_zero(list->head,list->levels << 3,node->levels << 3);
        if (ppaVar3 != (ares_slist_node_t **)0x0) {
          list->head = ppaVar3;
          list->levels = node->levels;
          goto LAB_0011b260;
        }
      }
    }
    ares_free(node->prev);
    ares_free(node->next);
    ares_free(node);
  }
  return (ares_slist_node_t *)0x0;
}

Assistant:

ares_slist_node_t *ares_slist_insert(ares_slist_t *list, void *val)
{
  ares_slist_node_t *node = NULL;

  if (list == NULL || val == NULL) {
    return NULL;
  }

  node = ares_malloc_zero(sizeof(*node));

  if (node == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->data   = val;
  node->parent = list;

  /* Randomly determine the number of levels we want to use */
  node->levels = ares_slist_calc_level(list);

  /* Allocate array of next and prev nodes for linking each level */
  node->next = ares_malloc_zero(sizeof(*node->next) * node->levels);
  if (node->next == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->prev = ares_malloc_zero(sizeof(*node->prev) * node->levels);
  if (node->prev == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* If the number of levels is greater than we currently support in the slist,
   * increase the count */
  if (list->levels < node->levels) {
    void *ptr =
      ares_realloc_zero(list->head, sizeof(*list->head) * list->levels,
                        sizeof(*list->head) * node->levels);
    if (ptr == NULL) {
      goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
    }

    list->head   = ptr;
    list->levels = node->levels;
  }

  ares_slist_node_push(list, node);

  list->cnt++;

  return node;

/* LCOV_EXCL_START: OutOfMemory */
fail:
  if (node) {
    ares_free(node->prev);
    ares_free(node->next);
    ares_free(node);
  }
  return NULL;
  /* LCOV_EXCL_STOP */
}